

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O3

void duckdb::Leaf::DeprecatedVacuum(ART *art,Node *node)

{
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  type paVar2;
  const_iterator cVar3;
  IndexPointer IVar4;
  iterator iVar5;
  pointer this_00;
  data_ptr_t pdVar6;
  ulong local_40;
  FixedSizeAllocator *local_38;
  
  paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  local_40 = (node->super_IndexPointer).data;
  if (local_40 >> 0x38 != 0) {
    local_38 = paVar2->_M_elems[1].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    this = &(local_38->vacuum_buffers)._M_h;
    do {
      local_40 = local_40 & 0xffffffff;
      cVar3 = ::std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(this,&local_40);
      IVar4.data = (node->super_IndexPointer).data;
      if (cVar3.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
        IVar4 = FixedSizeAllocator::VacuumPointer(local_38,IVar4);
        IVar4.data = IVar4.data & 0xffffffffffffff | 0x200000000000000;
        (node->super_IndexPointer).data = IVar4.data;
      }
      paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var1._M_head_impl =
           paVar2->_M_elems[1].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      local_40 = IVar4.data & 0xffffffff;
      iVar5 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&((_Var1._M_head_impl)->buffers)._M_h,&local_40);
      this_00 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                              *)((long)iVar5.
                                       super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                       ._M_cur + 0x10));
      pdVar6 = FixedSizeBuffer::Get(this_00,true);
      node = (Node *)(pdVar6 + (_Var1._M_head_impl)->bitmask_offset +
                               (ulong)((uint)(IVar4.data >> 0x20) & 0xffffff) *
                               (_Var1._M_head_impl)->segment_size + 0x28);
      local_40 = (node->super_IndexPointer).data;
    } while (0xffffffffffffff < local_40);
  }
  return;
}

Assistant:

void Leaf::DeprecatedVacuum(ART &art, Node &node) {
	D_ASSERT(node.HasMetadata());
	D_ASSERT(node.GetType() == LEAF);

	auto &allocator = Node::GetAllocator(art, LEAF);
	reference<Node> ref(node);
	while (ref.get().HasMetadata()) {
		if (allocator.NeedsVacuum(ref)) {
			ref.get() = allocator.VacuumPointer(ref);
			ref.get().SetMetadata(static_cast<uint8_t>(LEAF));
		}
		auto &leaf = Node::Ref<Leaf>(art, ref, LEAF);
		ref = leaf.ptr;
	}
}